

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool duckdb_snappy::RawUncompress(Source *compressed,char *uncompressed)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  SnappyArrayWriter output;
  SnappyDecompressor decompressor;
  uint32_t local_64;
  SnappyArrayWriter local_60;
  SnappyDecompressor local_40;
  
  local_40.peeked_ = 0;
  local_40.eof_ = false;
  local_40.ip_ = (char *)0x0;
  local_40.ip_limit_ = (char *)0x0;
  local_64 = 0;
  local_60.base_ = uncompressed;
  local_60.op_ = uncompressed;
  local_60.op_limit_ = uncompressed;
  local_60.op_limit_min_slop_ = uncompressed;
  local_40.reader_ = compressed;
  bVar1 = SnappyDecompressor::ReadUncompressedLength(&local_40,&local_64);
  if (bVar1) {
    (*compressed->_vptr_Source[2])(compressed);
    uVar2 = (ulong)local_64;
    local_60.op_limit_ = uncompressed + uVar2;
    uVar3 = 0x3f;
    if (uVar2 < 0x3f) {
      uVar3 = uVar2;
    }
    local_60.op_limit_min_slop_ = local_60.op_limit_ + -uVar3;
    SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyArrayWriter>(&local_40,&local_60);
    if (local_40.eof_ == true) {
      bVar1 = local_60.op_ == local_60.op_limit_;
      goto LAB_010f675f;
    }
  }
  bVar1 = false;
LAB_010f675f:
  (*(local_40.reader_)->_vptr_Source[4])(local_40.reader_,(ulong)local_40.peeked_);
  return bVar1;
}

Assistant:

bool RawUncompress(Source* compressed, char* uncompressed) {
  SnappyArrayWriter output(uncompressed);
  return InternalUncompress(compressed, &output);
}